

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

int food_detect(obj *sobj,boolean *scr_known)

{
  boolean bVar1;
  char oclass_00;
  byte bVar2;
  boolean bVar3;
  char *pcVar4;
  obj *poVar5;
  monst *obj_00;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  byte local_16c;
  obj *temp;
  char local_158 [7];
  boolean savebeginner;
  char buf [256];
  int uw;
  char *what;
  int local_38;
  char oclass;
  boolean stale;
  int iStack_34;
  boolean confused;
  int ctu;
  int ct;
  monst *mtmp;
  obj *obj;
  boolean *scr_known_local;
  obj *sobj_local;
  
  iStack_34 = 0;
  local_38 = 0;
  bVar8 = true;
  if ((u.uprops[0x1c].intrinsic == 0) && (bVar8 = false, sobj != (obj *)0x0)) {
    bVar8 = (*(uint *)&sobj->field_0x4a & 1) != 0;
  }
  oclass_00 = '\a';
  if (bVar8) {
    oclass_00 = '\b';
  }
  pcVar4 = "food";
  if (bVar8) {
    pcVar4 = "something";
  }
  bVar2 = (byte)u._1052_1_ >> 1 & 1;
  bVar3 = clear_stale_map(oclass_00,0);
  for (mtmp = (monst *)level->objlist; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
    poVar5 = o_in((obj *)mtmp,oclass_00);
    if (poVar5 != (obj *)0x0) {
      if (((char)mtmp->m_id == u.ux) && (*(char *)((long)&mtmp->m_id + 1) == u.uy)) {
        local_38 = local_38 + 1;
      }
      else {
        iStack_34 = iStack_34 + 1;
      }
    }
  }
  _ctu = level->monlist;
  do {
    if (_ctu == (monst *)0x0 || iStack_34 != 0) {
      if ((iStack_34 == 0) && (local_38 == 0)) {
        local_16c = 0;
        if (bVar3 != '\0') {
          local_16c = bVar8 ^ 0xff;
        }
        *scr_known = local_16c & 1;
        if (bVar3 == '\0') {
          if (sobj != (obj *)0x0) {
            pcVar4 = body_part(0x11);
            pcVar6 = "";
            if ((*(uint *)&sobj->field_0x4a >> 1 & 1) != 0 && ((byte)u._1052_1_ >> 6 & 1) == 0) {
              pcVar6 = " then starts to tingle";
            }
            sprintf(local_158,"Your %s twitches%s.",pcVar4,pcVar6);
            bVar1 = flags.beginner;
            if (((*(uint *)&sobj->field_0x4a >> 1 & 1) == 0) || (((byte)u._1052_1_ >> 6 & 1) != 0))
            {
              strange_feeling(sobj,local_158);
            }
            else {
              flags.beginner = '\0';
              strange_feeling(sobj,local_158);
              u._1052_1_ = u._1052_1_ & 0xbf | 0x40;
              flags.beginner = bVar1;
            }
          }
        }
        else {
          doredraw();
          pline("You sense a lack of %s nearby.",pcVar4);
          if ((sobj != (obj *)0x0) && ((*(uint *)&sobj->field_0x4a >> 1 & 1) != 0)) {
            if (((byte)u._1052_1_ >> 6 & 1) == 0) {
              pcVar4 = body_part(0x11);
              pline("Your %s starts to tingle.",pcVar4);
            }
            u._1052_1_ = u._1052_1_ & 0xbf | 0x40;
          }
        }
        sobj_local._4_4_ = (uint)((bVar3 != '\0' ^ 0xffU) & 1);
      }
      else {
        if (iStack_34 == 0) {
          *scr_known = '\x01';
          pcVar6 = "sense";
          if (sobj != (obj *)0x0) {
            pcVar6 = "smell";
          }
          pline("You %s %s nearby.",pcVar6,pcVar4);
          if ((sobj != (obj *)0x0) && ((*(uint *)&sobj->field_0x4a >> 1 & 1) != 0)) {
            if (((byte)u._1052_1_ >> 6 & 1) == 0) {
              pcVar4 = body_part(0x11);
              pline("Your %s starts to tingle.",pcVar4);
            }
            u._1052_1_ = u._1052_1_ & 0xbf | 0x40;
          }
        }
        else {
          *scr_known = '\x01';
          cls();
          u._1052_1_ = u._1052_1_ & 0xfd;
          for (mtmp = (monst *)level->objlist; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
            obj_00 = (monst *)o_in((obj *)mtmp,oclass_00);
            if (obj_00 != (monst *)0x0) {
              if (obj_00 != mtmp) {
                *(xchar *)&obj_00->m_id = (xchar)mtmp->m_id;
                *(xchar *)((long)&obj_00->m_id + 1) = *(xchar *)((long)&mtmp->m_id + 1);
              }
              map_object((obj *)obj_00,1);
            }
          }
          for (_ctu = level->monlist; _ctu != (monst *)0x0; _ctu = _ctu->nmon) {
            for (mtmp = (monst *)_ctu->minvent; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
              poVar5 = o_in((obj *)mtmp,oclass_00);
              if (poVar5 != (obj *)0x0) {
                poVar5->ox = _ctu->mx;
                poVar5->oy = _ctu->my;
                map_object(poVar5,1);
                break;
              }
            }
          }
          newsym((int)u.ux,(int)u.uy);
          if (sobj == (obj *)0x0) {
            pline("You sense %s.",pcVar4);
          }
          else if ((*(uint *)&sobj->field_0x4a >> 1 & 1) == 0) {
            pcVar6 = body_part(0x11);
            pline("Your %s tingles and you smell %s.",pcVar6,pcVar4);
          }
          else {
            pcVar6 = body_part(0x11);
            pcVar7 = "starts";
            if (((byte)u._1052_1_ >> 6 & 1) != 0) {
              pcVar7 = "continues";
            }
            pline("Your %s %s to tingle and you smell %s.",pcVar6,pcVar7,pcVar4);
            u._1052_1_ = u._1052_1_ & 0xbf | 0x40;
          }
          (*windowprocs.win_pause)(P_MAP);
          exercise(2,'\x01');
          doredraw();
          u._1052_1_ = u._1052_1_ & 0xfd | bVar2 << 1;
          if (bVar2 != 0) {
            under_water(2);
          }
          if (((byte)u._1052_1_ >> 5 & 1) != 0) {
            under_ground(2);
          }
        }
        sobj_local._4_4_ = 0;
      }
      return sobj_local._4_4_;
    }
    for (mtmp = (monst *)_ctu->minvent; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
      poVar5 = o_in((obj *)mtmp,oclass_00);
      if (poVar5 != (obj *)0x0) {
        iStack_34 = iStack_34 + 1;
        break;
      }
    }
    _ctu = _ctu->nmon;
  } while( true );
}

Assistant:

int food_detect(struct obj *sobj, boolean *scr_known)
{
    struct obj *obj;
    struct monst *mtmp;
    int ct = 0, ctu = 0;
    boolean confused = (Confusion || (sobj && sobj->cursed)), stale;
    char oclass = confused ? POTION_CLASS : FOOD_CLASS;
    const char *what = confused ? "something" : "food";
    int uw = u.uinwater;

    stale = clear_stale_map(oclass, 0);

    for (obj = level->objlist; obj; obj = obj->nobj)
	if (o_in(obj, oclass)) {
	    if (obj->ox == u.ux && obj->oy == u.uy) ctu++;
	    else ct++;
	}
    for (mtmp = level->monlist; mtmp && !ct; mtmp = mtmp->nmon) {
	/* no DEADMONSTER(mtmp) check needed since dmons never have inventory */
	for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (o_in(obj, oclass)) {
		ct++;
		break;
	    }
    }
    
    if (!ct && !ctu) {
	*scr_known = stale && !confused;
	if (stale) {
	    doredraw();
	    pline("You sense a lack of %s nearby.", what);
	    if (sobj && sobj->blessed) {
		if (!u.uedibility) pline("Your %s starts to tingle.", body_part(NOSE));
		u.uedibility = 1;
	    }
	} else if (sobj) {
	    char buf[BUFSZ];
	    sprintf(buf, "Your %s twitches%s.", body_part(NOSE),
			(sobj->blessed && !u.uedibility) ? " then starts to tingle" : "");
	    if (sobj->blessed && !u.uedibility) {
		boolean savebeginner = flags.beginner;	/* prevent non-delivery of */
		flags.beginner = FALSE;			/* 	message            */
		strange_feeling(sobj, buf);
		flags.beginner = savebeginner;
		u.uedibility = 1;
	    } else
		strange_feeling(sobj, buf);
	}
	return !stale;
    } else if (!ct) {
	*scr_known = TRUE;
	pline("You %s %s nearby.", sobj ? "smell" : "sense", what);
	if (sobj && sobj->blessed) {
		if (!u.uedibility) pline("Your %s starts to tingle.", body_part(NOSE));
		u.uedibility = 1;
	}
    } else {
	struct obj *temp;
	*scr_known = TRUE;
	cls();
	u.uinwater = 0;
	for (obj = level->objlist; obj; obj = obj->nobj)
	    if ((temp = o_in(obj, oclass)) != 0) {
		if (temp != obj) {
		    temp->ox = obj->ox;
		    temp->oy = obj->oy;
		}
		map_object(temp,1);
	    }
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    /* no DEADMONSTER(mtmp) check needed since dmons never have inventory */
	    for (obj = mtmp->minvent; obj; obj = obj->nobj)
		if ((temp = o_in(obj, oclass)) != 0) {
		    temp->ox = mtmp->mx;
		    temp->oy = mtmp->my;
		    map_object(temp,1);
		    break;	/* skip rest of this monster's inventory */
		}
	newsym(u.ux,u.uy);
	if (sobj) {
	    if (sobj->blessed) {
	    	pline("Your %s %s to tingle and you smell %s.", body_part(NOSE),
	    		u.uedibility ? "continues" : "starts", what);
		u.uedibility = 1;
	    } else
		pline("Your %s tingles and you smell %s.", body_part(NOSE), what);
	}
	else pline("You sense %s.", what);
	win_pause_output(P_MAP);
	exercise(A_WIS, TRUE);
	doredraw();
	u.uinwater = uw;
	if (Underwater) under_water(2);
	if (u.uburied) under_ground(2);
    }
    return 0;
}